

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

SizedPtr google::protobuf::internal::anon_unknown_12::AllocateBlock
                   (AllocationPolicy *policy_ptr,size_t last_size,size_t min_bytes)

{
  size_t sVar1;
  Nonnull<const_char_*> pcVar2;
  ulong size;
  size_t sVar3;
  SizedPtr SVar4;
  AllocationPolicy policy;
  AllocationPolicy local_58;
  
  local_58.start_block_size = 0x100;
  local_58.max_block_size = 0x8000;
  local_58.block_alloc = (_func_void_ptr_size_t *)0x0;
  local_58.block_dealloc = (_func_void_void_ptr_size_t *)0x0;
  if (policy_ptr != (AllocationPolicy *)0x0) {
    local_58.start_block_size = policy_ptr->start_block_size;
    local_58.max_block_size = policy_ptr->max_block_size;
    local_58.block_alloc = policy_ptr->block_alloc;
    local_58.block_dealloc = policy_ptr->block_dealloc;
  }
  sVar3 = local_58.max_block_size;
  sVar1 = local_58.start_block_size;
  if (min_bytes < 0xfffffffffffffff0) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (min_bytes,0xffffffffffffffef,
                        "min_bytes <= std::numeric_limits<size_t>::max() - SerialArena::kBlockHeaderSize"
                       );
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    if (last_size * 2 < sVar3) {
      sVar3 = last_size * 2;
    }
    if (last_size == 0) {
      sVar3 = sVar1;
    }
    size = min_bytes + 0x10;
    if (min_bytes + 0x10 < sVar3) {
      size = sVar3;
    }
    SVar4 = AllocateMemory(&local_58,size);
    return SVar4;
  }
  _GLOBAL__N_1::AllocateBlock();
}

Assistant:

SizedPtr AllocateBlock(const AllocationPolicy* policy_ptr, size_t last_size,
                       size_t min_bytes) {
  AllocationPolicy policy;  // default policy
  if (policy_ptr) policy = *policy_ptr;
  size_t size =
      AllocationSize(last_size, policy.start_block_size, policy.max_block_size);
  // Verify that min_bytes + kBlockHeaderSize won't overflow.
  ABSL_CHECK_LE(min_bytes, std::numeric_limits<size_t>::max() -
                               SerialArena::kBlockHeaderSize);
  size = std::max(size, SerialArena::kBlockHeaderSize + min_bytes);

  return AllocateMemory(policy, size);
}